

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::image::anon_unknown_0::StoreTest::createInstance(StoreTest *this,Context *context)

{
  StoreTestInstance *this_00;
  Texture *this_01;
  int iVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  StoreTestInstance *this_02;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  VkDeviceSize VVar5;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  Image *this_03;
  Buffer *this_04;
  long lVar6;
  ulong uVar7;
  int *piVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> local_b0;
  undefined1 *local_a0;
  int *local_98;
  StoreTestInstance *local_90;
  VkImageCreateInfo local_88;
  
  if ((this->m_texture).m_type == IMAGE_TYPE_BUFFER) {
    this_02 = (StoreTestInstance *)operator_new(200);
    StoreTestInstance::StoreTestInstance
              (this_02,context,&this->m_texture,this->m_format,this->m_declareImageFormatInShader,
               false);
    (this_02->super_BaseTestInstance).super_TestInstance._vptr_TestInstance =
         (_func_int **)&PTR__BufferStoreTestInstance_00cfdfe8;
    this_02[1].super_BaseTestInstance.super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
    this_02[1].super_BaseTestInstance.super_TestInstance.m_context = (Context *)0x0;
    this_02[1].super_BaseTestInstance.m_texture.m_layerSize = (int  [3])0x0;
    this_02[1].super_BaseTestInstance.m_texture.m_type = IMAGE_TYPE_1D;
    *(undefined1 (*) [16])&this_02[1].super_BaseTestInstance.m_texture.m_numLayers =
         (undefined1  [16])0x0;
    this_02[1].m_imageBuffer.
    super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data =
         (PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>)0x0;
    *(undefined1 (*) [16])&this_02[1].m_imageSizeBytes = (undefined1  [16])0x0;
    *(undefined1 (*) [16])&this_02[2].super_BaseTestInstance.super_TestInstance.m_context =
         (undefined1  [16])0x0;
    *(undefined1 (*) [16])(this_02[2].super_BaseTestInstance.m_texture.m_layerSize.m_data + 2) =
         (undefined1  [16])0x0;
    *(undefined1 (*) [16])&this_02[2].super_BaseTestInstance.m_format = (undefined1  [16])0x0;
  }
  else {
    this_02 = (StoreTestInstance *)operator_new(0xe0);
    StoreTestInstance::StoreTestInstance
              (this_02,context,&this->m_texture,this->m_format,this->m_declareImageFormatInShader,
               this->m_singleLayerBind);
    (this_02->super_BaseTestInstance).super_TestInstance._vptr_TestInstance =
         (_func_int **)&PTR__ImageStoreTestInstance_00cfe150;
    this_00 = this_02 + 1;
    this_02[1].super_BaseTestInstance.super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
    this_01 = &this_02[1].super_BaseTestInstance.m_texture;
    this_02[1].super_BaseTestInstance.m_texture.m_layerSize.m_data[0] = 0;
    this_02[1].super_BaseTestInstance.m_texture.m_layerSize.m_data[1] = 0;
    local_90 = this_00;
    vki = Context::getInstanceInterface(context);
    physDevice = Context::getPhysicalDevice(context);
    VVar5 = getOptimalUniformBufferChunkSize(vki,physDevice,4);
    this_02[1].super_BaseTestInstance.m_texture.m_numLayers = (int)VVar5;
    this_02[1].super_BaseTestInstance.m_texture.m_numSamples = (int)(VVar5 >> 0x20);
    piVar8 = &this_02[2].super_BaseTestInstance.m_texture.m_numLayers;
    *(undefined1 (*) [16])&this_02[1].super_BaseTestInstance.m_format = (undefined1  [16])0x0;
    *(undefined1 (*) [16])
     &this_02[1].m_imageBuffer.
      super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.field_0x8
         = (undefined1  [16])0x0;
    this_02[2].super_BaseTestInstance.super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
    this_02[2].super_BaseTestInstance.super_TestInstance.m_context = (Context *)0x0;
    this_02[2].super_BaseTestInstance.m_texture.m_layerSize = (int  [3])0x0;
    this_02[2].super_BaseTestInstance.m_texture.m_type = IMAGE_TYPE_1D;
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
    ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
              *)piVar8,(long)(this->m_texture).m_numLayers,(allocator_type *)&local_88);
    local_a0 = &this_02[2].m_imageBuffer.
                super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data
                .field_0x8;
    local_98 = piVar8;
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              *)local_a0,(long)(this->m_texture).m_numLayers,(allocator_type *)&local_88);
    vk = Context::getDeviceInterface((this_02->super_BaseTestInstance).super_TestInstance.m_context)
    ;
    device = Context::getDevice((this_02->super_BaseTestInstance).super_TestInstance.m_context);
    allocator = Context::getDefaultAllocator
                          ((this_02->super_BaseTestInstance).super_TestInstance.m_context);
    this_03 = (Image *)operator_new(0x30);
    makeImageCreateInfo(&local_88,&(this_02->super_BaseTestInstance).m_texture,
                        (this_02->super_BaseTestInstance).m_format,9,0);
    Image::Image(this_03,vk,device,allocator,&local_88,(MemoryRequirement)0x0);
    local_b0.m_data.ptr = (Buffer *)0x0;
    if ((Image *)(this_00->super_BaseTestInstance).super_TestInstance._vptr_TestInstance != this_03)
    {
      de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::reset
                ((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)this_00);
      (this_00->super_BaseTestInstance).super_TestInstance._vptr_TestInstance =
           (_func_int **)this_03;
    }
    de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::reset
              ((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)&local_b0);
    iVar1 = (this_02->super_BaseTestInstance).m_texture.m_numLayers;
    VVar5 = *(long *)&this_02[1].super_BaseTestInstance.m_texture.m_numLayers * (long)iVar1;
    this_04 = (Buffer *)operator_new(0x30);
    makeBufferCreateInfo((VkBufferCreateInfo *)&local_88,VVar5,0x10);
    image::Buffer::Buffer
              (this_04,vk,device,allocator,(VkBufferCreateInfo *)&local_88,(MemoryRequirement)0x1);
    local_b0.m_data.ptr = (Buffer *)0x0;
    if (*(Buffer **)(this_01->m_layerSize).m_data != this_04) {
      de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::reset
                ((UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)this_01)
      ;
      *(Buffer **)(this_01->m_layerSize).m_data = this_04;
    }
    de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::reset
              (&local_b0);
    lVar2 = **(long **)(this_01->m_layerSize).m_data;
    piVar8 = *(int **)(lVar2 + 0x18);
    memset(piVar8,0,VVar5);
    auVar4 = _DAT_00a99450;
    if (0 < iVar1) {
      lVar3 = *(long *)&this_02[1].super_BaseTestInstance.m_texture.m_numLayers;
      lVar6 = (long)iVar1 + -1;
      auVar9._8_4_ = (int)lVar6;
      auVar9._0_8_ = lVar6;
      auVar9._12_4_ = (int)((ulong)lVar6 >> 0x20);
      uVar7 = 0;
      auVar9 = auVar9 ^ _DAT_00a99450;
      auVar10 = _DAT_00a99400;
      do {
        auVar11 = auVar10 ^ auVar4;
        if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                    auVar9._4_4_ < auVar11._4_4_) & 1)) {
          *piVar8 = (int)uVar7;
        }
        if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
            auVar11._12_4_ <= auVar9._12_4_) {
          *(int *)((long)piVar8 + lVar3) = (int)uVar7 + 1;
        }
        uVar7 = uVar7 + 2;
        lVar6 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar6 + 2;
        piVar8 = (int *)((long)piVar8 + lVar3 * 2);
      } while ((iVar1 + 1U & 0xfffffffe) != uVar7);
    }
    ::vk::flushMappedMemoryRange
              (vk,device,(VkDeviceMemory)*(deUint64 *)(lVar2 + 8),*(VkDeviceSize *)(lVar2 + 0x10),
               VVar5);
  }
  return (TestInstance *)this_02;
}

Assistant:

TestInstance* StoreTest::createInstance (Context& context) const
{
	if (m_texture.type() == IMAGE_TYPE_BUFFER)
		return new BufferStoreTestInstance(context, m_texture, m_format, m_declareImageFormatInShader);
	else
		return new ImageStoreTestInstance(context, m_texture, m_format, m_declareImageFormatInShader, m_singleLayerBind);
}